

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

void putRGBUAcontig16bittile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  byte bVar1;
  ushort uVar2;
  uint8_t *puVar3;
  uint8_t *m;
  uint32_t a;
  uint32_t b;
  uint32_t g;
  uint32_t r;
  uint16_t *wp;
  uint32_t local_28;
  int samplesperpixel;
  uint32_t h_local;
  uint32_t w_local;
  uint32_t y_local;
  uint32_t x_local;
  uint32_t *cp_local;
  TIFFRGBAImage *img_local;
  
  uVar2 = img->samplesperpixel;
  _g = (ushort *)pp;
  _y_local = cp;
  for (local_28 = h; w_local = w, local_28 != 0; local_28 = local_28 - 1) {
    for (; w_local != 0; w_local = w_local - 1) {
      bVar1 = img->Bitdepth16To8[_g[3]];
      puVar3 = img->UaToAa;
      *_y_local = CONCAT13(bVar1,CONCAT12(puVar3[(ulong)img->Bitdepth16To8[_g[2]] +
                                                 (ulong)bVar1 * 0x100],
                                          CONCAT11(puVar3[(ulong)img->Bitdepth16To8[_g[1]] +
                                                          (ulong)bVar1 * 0x100],
                                                   puVar3[(ulong)img->Bitdepth16To8[*_g] +
                                                          (ulong)bVar1 * 0x100])));
      _g = _g + (int)(uint)uVar2;
      _y_local = _y_local + 1;
    }
    _y_local = _y_local + toskew;
    _g = _g + (int)((uint)uVar2 * fromskew);
  }
  return;
}

Assistant:

DECLAREContigPutFunc(putRGBUAcontig16bittile)
{
    int samplesperpixel = img->samplesperpixel;
    uint16_t *wp = (uint16_t *)pp;
    (void)y;
    fromskew *= samplesperpixel;
    for (; h > 0; --h)
    {
        uint32_t r, g, b, a;
        uint8_t *m;
        for (x = w; x > 0; --x)
        {
            a = img->Bitdepth16To8[wp[3]];
            m = img->UaToAa + ((size_t)a << 8);
            r = m[img->Bitdepth16To8[wp[0]]];
            g = m[img->Bitdepth16To8[wp[1]]];
            b = m[img->Bitdepth16To8[wp[2]]];
            *cp++ = PACK4(r, g, b, a);
            wp += samplesperpixel;
        }
        cp += toskew;
        wp += fromskew;
    }
}